

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

void luaL_requiref(lua_State *L,char *modname,lua_CFunction openf,int glb)

{
  int iVar1;
  
  luaL_getsubtable(L,-0xf4628,"_LOADED");
  lua_getfield(L,-1,modname);
  iVar1 = lua_toboolean(L,-1);
  if (iVar1 == 0) {
    lua_settop(L,-2);
    lua_pushcclosure(L,openf,0);
    lua_pushstring(L,modname);
    lua_callk(L,1,1,0,(lua_KFunction)0x0);
    lua_pushvalue(L,-1);
    lua_setfield(L,-3,modname);
  }
  lua_rotate(L,-2,-1);
  lua_settop(L,-2);
  if (glb != 0) {
    lua_pushvalue(L,-1);
    lua_setglobal(L,modname);
    return;
  }
  return;
}

Assistant:

LUALIB_API void luaL_requiref(lua_State *L, const char *modname,
                              lua_CFunction openf, int glb) {
    luaL_getsubtable(L, LUA_REGISTRYINDEX, LUA_LOADED_TABLE);
    lua_getfield(L, -1, modname);  /* LOADED[modname] */
    if (!lua_toboolean(L, -1)) {  /* package not already loaded? */
        lua_pop(L, 1);  /* remove field */
        lua_pushcfunction(L, openf);
        lua_pushstring(L, modname);  /* argument to open function */
        lua_call(L, 1, 1);  /* call 'openf' to open module */
        lua_pushvalue(L, -1);  /* make copy of module (call result) */
        lua_setfield(L, -3, modname);  /* LOADED[modname] = module */
    }
    lua_remove(L, -2);  /* remove LOADED table */
    if (glb) {
        lua_pushvalue(L, -1);  /* copy of module */
        lua_setglobal(L, modname);  /* _G[modname] = module */
    }
}